

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.hpp
# Opt level: O2

void __thiscall
covec::Covec<float>::
accumulate_grad<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>>
          (Covec<float> *this,
          vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
          *grad,vector<unsigned_long,_std::allocator<unsigned_long>_> *sample,POS_NEG pos_neg,
          size_t K)

{
  long *plVar1;
  float fVar2;
  pointer psVar3;
  pointer psVar4;
  pointer psVar5;
  pointer puVar6;
  pointer psVar7;
  unsigned_long uVar8;
  long lVar9;
  unsigned_long uVar10;
  long lVar11;
  pointer ppVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  size_t k;
  size_t sVar16;
  float fVar17;
  double dVar18;
  float fVar19;
  vector<float,_std::allocator<float>_> Hadamard_product;
  allocator_type local_6d;
  float local_6c;
  ulong local_68;
  vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
  *local_60;
  long local_58;
  _Vector_base<float,_std::allocator<float>_> local_50;
  value_type_conflict3 local_34;
  
  if ((long)(this->num_entries_).
            super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->num_entries_).
            super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x20) {
    accumulate_grad_2<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>>
              (this,grad,sample,pos_neg,K);
    return;
  }
  local_34 = 1.0;
  local_60 = grad;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_50,this->dim_,&local_34,&local_6d);
  psVar3 = (this->num_entries_).
           super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar4 = (this->vs_).
           super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = (this->num_entries_).
           super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (sample->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  psVar7 = (this->cs_).
           super__Vector_base<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar15 = 0; lVar15 != (long)psVar3 - (long)psVar5 >> 4; lVar15 = lVar15 + 1) {
    uVar8 = puVar6[lVar15];
    plVar1 = (long *)(*(long *)&(psVar7[lVar15].
                                 super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> +
                     uVar8 * 8);
    *plVar1 = *plVar1 + 1;
    lVar9 = *(long *)&(psVar4[lVar15].
                       super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ;
    for (sVar16 = 0; K != sVar16; sVar16 = sVar16 + 1) {
      local_50._M_impl.super__Vector_impl_data._M_start[sVar16] =
           *(float *)(*(long *)(uVar8 * 0x18 + lVar9) + sVar16 * 4) *
           local_50._M_impl.super__Vector_impl_data._M_start[sVar16];
    }
  }
  dVar18 = std::
           accumulate<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,double>
                     ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                      local_50._M_impl.super__Vector_impl_data._M_start,
                      (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                      local_50._M_impl.super__Vector_impl_data._M_finish,0.0);
  fVar17 = expf(-(float)dVar18);
  local_6c = 1.0 / (fVar17 + 1.0);
  if (pos_neg == POSITIVE) {
    local_6c = 1.0 - local_6c;
  }
  else {
    local_6c = -local_6c;
  }
  local_58 = (long)(this->num_entries_).
                   super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->num_entries_).
                   super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_68 = K + 1;
  for (lVar15 = 0; lVar15 != local_58; lVar15 = lVar15 + 1) {
    puVar6 = (sample->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = puVar6[lVar15];
    lVar9 = *(long *)&((this->cs_).
                       super__Vector_base<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar15].
                       super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
    plVar1 = (long *)(lVar9 + uVar8 * 8);
    *plVar1 = *plVar1 + 1;
    uVar10 = puVar6[lVar15];
    lVar11 = *(long *)&((this->vs_).
                        super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar15].
                        super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ;
    ppVar12 = (local_60->
              super__Vector_base<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppVar12[lVar15].first = uVar10;
    fVar17 = next_eta(this,*(size_t *)(lVar9 + uVar8 * 8));
    for (sVar16 = 0; K != sVar16; sVar16 = sVar16 + 1) {
      fVar2 = local_50._M_impl.super__Vector_impl_data._M_start[sVar16];
      fVar19 = 0.0;
      if ((fVar2 != 0.0) || (NAN(fVar2))) {
        fVar19 = (fVar2 * fVar17 * local_6c) /
                 *(float *)(*(long *)(uVar10 * 0x18 + lVar11) + sVar16 * 4);
      }
      *(float *)(*(long *)&ppVar12[lVar15].second.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data + sVar16 * 4) = fVar19;
    }
    uVar13 = this->dim_;
    for (uVar14 = local_68; uVar14 < uVar13; uVar14 = uVar14 + 1) {
      *(undefined4 *)
       (*(long *)&ppVar12[lVar15].second.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data + uVar14 * 4) = 0;
    }
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_50);
  return;
}

Assistant:

void Covec<Real>::accumulate_grad(Grad& grad
                                    , const std::vector<std::size_t>& sample
                                    , const typename Covec::POS_NEG pos_neg
				    , const std::size_t K)
  {
    assert( sample.size() == this->order() );

    if( this->order() == 2 ){
      return accumulate_grad_2(grad, sample, pos_neg, K);
    }

    // count the occurences and
    // compute Hadamard product, inner_product, sigmoid of inner_product
    std::vector<Real> Hadamard_product(this->dimension(), 1.0);
    for(std::size_t i = 0, I = this->order(); i < I; ++i){
      const auto j = sample[i];
      ++(*this->cs_[i])[j];
      const auto& v = (*this->vs_[i])[j];
      assert( v.size() == this->dimension() );
      for(std::size_t k = 0; k < K; ++k){
        Hadamard_product[k] *= v[k];
      }
    }
    Real inner_product =
      static_cast<Real>(std::accumulate(Hadamard_product.begin(), Hadamard_product.end(), 0.0));
    Real sigmoid = static_cast<Real>( 1.0 / ( 1 + std::exp(-inner_product) ) );
    Real coeff = (pos_neg == POSITIVE ? 1 - sigmoid : -sigmoid);

    // compute gradients
    for(std::size_t i = 0, I = this->order(); i < I; ++i){
      const auto& j = sample[i];
      auto& cs_ij = (*this->cs_[i])[j];
      ++cs_ij;
      const auto& v = (*this->vs_[i])[j];
      auto& grad_i = grad[i];
      grad_i.first = j;
      auto& g = grad_i.second;
      auto eta = this->next_eta(cs_ij);
      const auto C = coeff * eta;
      for(std::size_t k = 0; k < K; ++k){
        if( Hadamard_product[k] == 0 ){
	  g[k] = 0;
	  continue;
	}
        g[k] = C * Hadamard_product[k] / v[k];
      }
      for(std::size_t k = K + 1; k < this->dimension(); ++k){
	g[k] = 0;
      }
    }

  }